

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain_of_responsibility.cc
# Opt level: O0

int __thiscall BaseHandler::handle(BaseHandler *this,int i)

{
  code *pcVar1;
  uint uVar2;
  int i_local;
  BaseHandler *this_local;
  
  uVar2 = (**this->_vptr_BaseHandler)(this,(ulong)(uint)i);
  if ((uVar2 & 1) == 0) {
    if (this->sucessor != (BaseHandler *)0x0) {
      handle(this->sucessor,i);
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    this_local._4_4_ = 0;
  }
  else {
    this_local._4_4_ = (*this->_vptr_BaseHandler[1])(this,(ulong)(uint)i);
  }
  return this_local._4_4_;
}

Assistant:

int handle(int i) {
    if (canHandle(i)) {
      return value(i);
    } else if (sucessor) {
      sucessor->handle(i);
    } else {
      return 0;
    }
  }